

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall
CNetAddr::SerializeV2Stream<ParamsStream<DataStream&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<DataStream_&,_CAddress::SerParams> *s)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_1a;
  BIP155Network local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsInternal(this);
  if (bVar1) {
    local_1a = 2;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
               (s->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_1a);
    WriteCompactSize<ParamsStream<DataStream&,CAddress::SerParams>>(s,0x10);
    SerializeV1Stream<ParamsStream<DataStream&,CAddress::SerParams>>(this,s);
  }
  else {
    local_19 = GetBIP155Network(this);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
               (s->m_substream->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_19);
    ParamsStream<DataStream&,CAddress::SerParams>::operator<<
              ((ParamsStream<DataStream&,CAddress::SerParams> *)s,&this->m_addr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV2Stream(Stream& s) const
    {
        if (IsInternal()) {
            // Serialize NET_INTERNAL as embedded in IPv6. We need to
            // serialize such addresses from addrman.
            s << static_cast<uint8_t>(BIP155Network::IPV6);
            s << COMPACTSIZE(ADDR_IPV6_SIZE);
            SerializeV1Stream(s);
            return;
        }

        s << static_cast<uint8_t>(GetBIP155Network());
        s << m_addr;
    }